

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

bilingual_str * common::AmountHighWarn(bilingual_str *__return_storage_ptr__,string *optname)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  long in_FS_OFFSET;
  bilingual_str local_60;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  _(&local_60,(ConstevalStringLiteral)0x707b78);
  tinyformat::format<std::__cxx11::string>
            (__return_storage_ptr__,(tinyformat *)&local_60,(bilingual_str *)optname,in_RCX);
  bilingual_str::~bilingual_str(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str AmountHighWarn(const std::string& optname)
{
    return strprintf(_("%s is set very high!"), optname);
}